

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_switch::run_impl(statement_switch *this)

{
  size_t sVar1;
  MappedReference<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>_> ppsVar2;
  statement_block *this_00;
  var key;
  slot_type *local_20;
  
  local_20 = (slot_type *)(this->mTree).mRoot;
  runtime_type::parse_expr
            ((runtime_type *)&stack0xffffffffffffffd8,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(&stack0xffffffffffffffe0,0));
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
          ::count<cs_impl::any>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                      *)&this->mCases,(key_arg<cs_impl::any> *)&stack0xffffffffffffffd8);
  if (sVar1 == 0) {
    this_00 = this->mDefault;
    if (this_00 == (statement_block *)0x0) goto LAB_0015de23;
  }
  else {
    ppsVar2 = phmap::priv::
              raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
              ::
              operator[]<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>>
                        ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
                          *)&this->mCases,(key_arg<cs_impl::any> *)&stack0xffffffffffffffd8);
    this_00 = *ppsVar2;
  }
  statement_base::run(&this_00->super_statement_base);
LAB_0015de23:
  cs_impl::any::recycle((any *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void statement_switch::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		var key = context->instance->parse_expr(mTree.root());
		if (mCases.count(key) > 0)
			mCases[key]->run();
		else if (mDefault != nullptr)
			mDefault->run();
	}